

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O2

void __thiscall pstack::Elf::Notes::iterator::startSection(iterator *this)

{
  element_type *peVar1;
  Elf64_Phdr *pEVar2;
  string local_58 [32];
  __shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2> local_38;
  allocator<char> local_21;
  
  this->offset = 0;
  peVar1 = (this->object->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>(local_58,"note section",&local_21);
  pEVar2 = (this->phdrsi)._M_current;
  (*peVar1->_vptr_Reader[9])(&local_38,peVar1,local_58,pEVar2->p_offset,pEVar2->p_filesz);
  std::__shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>,
             &local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void Notes::iterator::startSection() {
    offset = 0;
    io = object->io->view("note section", Off(phdrsi->p_offset), size_t(phdrsi->p_filesz));
}